

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

void __thiscall QToolBar::changeEvent(QToolBar *this,QEvent *event)

{
  short sVar1;
  long lVar2;
  long lVar3;
  QString *pQVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  QSize local_90;
  QStyleOptionToolBar opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QWidget).field_0x8;
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 100) {
    (**(code **)(**(long **)(lVar3 + 0x278) + 0x70))();
    if (*(char *)(lVar3 + 0x254) == '\0') {
      opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionToolBar::QStyleOptionToolBar(&opt);
      (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&opt);
      pQVar5 = QWidget::style(&this->super_QWidget);
      local_90.wd.m_i = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x3b,&opt,this);
      local_90.ht.m_i = local_90.wd.m_i;
      setIconSize(this,&local_90);
      *(undefined1 *)(lVar3 + 0x254) = 0;
      QStyleOption::~QStyleOption(&opt.super_QStyleOption);
    }
    QToolBarLayout::updateMarginAndSpacing(*(QToolBarLayout **)(lVar3 + 0x278));
  }
  else if (sVar1 == 0x5a) {
    (**(code **)(**(long **)(lVar3 + 0x278) + 0x70))();
  }
  else if (sVar1 == 0x21) {
    pQVar4 = *(QString **)(lVar3 + 0x270);
    QWidget::windowTitle((QString *)&opt,&this->super_QWidget);
    QAction::setText(pQVar4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
  }
  QWidget::changeEvent(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::changeEvent(QEvent *event)
{
    Q_D(QToolBar);
    switch (event->type()) {
    case QEvent::WindowTitleChange:
        d->toggleViewAction->setText(windowTitle());
        break;
    case QEvent::StyleChange:
        d->layout->invalidate();
        if (!d->explicitIconSize) {
            QStyleOptionToolBar opt;
            initStyleOption(&opt);
            const int metric = style()->pixelMetric(QStyle::PM_ToolBarIconSize, &opt, this);
            setIconSize({metric, metric});
            d->explicitIconSize = false;
        }
        d->layout->updateMarginAndSpacing();
        break;
    case QEvent::LayoutDirectionChange:
        d->layout->invalidate();
        break;
    default:
        break;
    }
    QWidget::changeEvent(event);
}